

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::ByteCodeUsesInstr::Set(ByteCodeUsesInstr *this,Opnd *originalOperand)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  JitArenaAllocator *pJVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_48;
  SymID local_20;
  byte local_19;
  SymID symId;
  bool isJITOptimizedReg;
  Opnd *originalOperand_local;
  ByteCodeUsesInstr *this_local;
  
  _symId = originalOperand;
  originalOperand_local = (Opnd *)this;
  if (originalOperand != (Opnd *)0x0) {
    pSVar3 = Opnd::GetStackSym(originalOperand);
    if (pSVar3 != (StackSym *)0x0) goto LAB_00625269;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0x3be,"(originalOperand && originalOperand->GetStackSym())",
                     "originalOperand && originalOperand->GetStackSym()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_00625269:
  local_19 = Opnd::GetIsJITOptimizedReg(_symId);
  pSVar3 = Opnd::GetStackSym(_symId);
  local_20 = (pSVar3->super_Sym).m_id;
  if ((local_19 & 1) == 0) {
    if (this->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar5 = ((this->super_Instr).m_func)->m_alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_48,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                 ,0x3cb);
      pJVar5 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar5,&local_48);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,((this->super_Instr).m_func)->m_alloc);
      this->byteCodeUpwardExposedUsed = this_00;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this->byteCodeUpwardExposedUsed,local_20);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x3c3,"(false)",
                       "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeUsesInstr::Set(IR::Opnd * originalOperand)
{
    Assert(originalOperand && originalOperand->GetStackSym());
    bool isJITOptimizedReg = originalOperand->GetIsJITOptimizedReg();
    SymID symId = originalOperand->GetStackSym()->m_id;
    if (isJITOptimizedReg)
    {
        AssertMsg(false, "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
        // Although we assert on debug builds, we should actually be ok with release builds
        // if we ignore the operand; not ignoring it, however, can cause us to introduce an
        // inconsistency in bytecode register lifetimes.
        return;
    }
    if (!this->byteCodeUpwardExposedUsed)
    {
        this->byteCodeUpwardExposedUsed = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
    }
    this->byteCodeUpwardExposedUsed->Set(symId);
}